

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,REF_DBL *hessian)

{
  double *pdVar1;
  double dVar2;
  REF_NODE ref_node;
  REF_GLOB *pRVar3;
  REF_NODE pRVar4;
  REF_ADJ_ITEM pRVar5;
  double dVar6;
  double dVar7;
  uint id;
  uint uVar8;
  REF_STATUS RVar9;
  REF_CLOUD *one_layer;
  REF_ADJ pRVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  REF_DBL *pRVar14;
  undefined8 uVar15;
  uint uVar16;
  REF_CLOUD *ref_cloud_ptr;
  long lVar17;
  char *pcVar18;
  REF_CELL pRVar19;
  long lVar20;
  REF_INT node;
  long lVar21;
  bool bVar22;
  REF_BOOL has_support;
  REF_INT max_id;
  REF_CLOUD ref_cloud;
  REF_INT min_id;
  REF_INT geom;
  REF_DBL node_hessian [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL n [3];
  ulong local_110;
  int local_108;
  int local_104;
  double *local_100;
  REF_CLOUD local_f8;
  uint local_f0;
  int local_ec;
  double local_e8;
  double dStack_e0;
  double local_d8;
  REF_DBL *local_d0;
  long local_c8;
  REF_CELL local_c0;
  REF_FACELIFT local_b8;
  REF_GEOM local_b0;
  REF_DBL local_a8;
  REF_DBL local_a0;
  REF_DBL local_98;
  double local_90;
  REF_DBL local_88 [4];
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  ref_node = ref_grid->node;
  pRVar19 = ref_grid->cell[3];
  iVar12 = ref_node->max;
  lVar21 = (long)iVar12;
  if (0 < lVar21) {
    pRVar3 = ref_node->global;
    lVar13 = 0;
    pRVar14 = hessian;
    do {
      if (-1 < pRVar3[lVar13]) {
        *pRVar14 = 0.0;
        pRVar14[1] = 0.0;
        pRVar14[2] = 0.0;
      }
      lVar13 = lVar13 + 1;
      pRVar14 = pRVar14 + 3;
    } while (lVar21 != lVar13);
  }
  if (iVar12 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6,
           "ref_recon_rsn_hess_face","malloc one_layer of REF_CLOUD negative");
    uVar8 = 1;
  }
  else {
    one_layer = (REF_CLOUD *)malloc(lVar21 * 8);
    if (one_layer == (REF_CLOUD *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x6b6
             ,"ref_recon_rsn_hess_face","malloc one_layer of REF_CLOUD NULL");
      uVar8 = 2;
    }
    else {
      if (iVar12 != 0) {
        memset(one_layer,0,lVar21 * 8);
      }
      uVar8 = ref_cell_id_range(pRVar19,ref_grid->mpi,(REF_INT *)&local_f0,&local_104);
      if (uVar8 == 0) {
        if ((int)local_f0 <= local_104) {
          uVar11 = (ulong)(uint)ref_node->max;
          id = local_f0;
          do {
            local_110 = (ulong)id;
            if (0 < (int)uVar11) {
              lVar21 = 0;
              ref_cloud_ptr = one_layer;
              do {
                if (-1 < ref_node->global[lVar21]) {
                  uVar8 = ref_cloud_create(ref_cloud_ptr,4);
                  if (uVar8 != 0) {
                    pcVar18 = "cloud storage";
                    uVar15 = 0x6bc;
                    goto LAB_001bc43d;
                  }
                  uVar11 = (ulong)(uint)ref_node->max;
                }
                lVar21 = lVar21 + 1;
                ref_cloud_ptr = ref_cloud_ptr + 1;
              } while (lVar21 < (int)uVar11);
            }
            pRVar4 = ref_grid->node;
            iVar12 = pRVar4->max;
            if (0 < iVar12) {
              pRVar19 = ref_grid->cell[3];
              local_b0 = ref_grid->geom;
              local_b8 = local_b0->ref_facelift;
              lVar21 = 0;
              local_c0 = pRVar19;
LAB_001bc58e:
              if ((((-1 < pRVar4->global[lVar21]) && (pRVar4->ref_mpi->id == pRVar4->part[lVar21]))
                  && (pRVar10 = pRVar19->ref_adj, lVar21 < pRVar10->nnode)) &&
                 (lVar13 = (long)pRVar10->first[lVar21], lVar13 != -1)) {
                pRVar5 = pRVar10->item + lVar13;
                iVar12 = pRVar19->node_per;
                local_d0 = hessian;
                do {
                  local_100 = (double *)(long)pRVar5->ref;
                  if ((pRVar19->c2n[pRVar19->size_per * pRVar5->ref + iVar12] == id) && (0 < iVar12)
                     ) {
                    lVar20 = 0;
                    local_c8 = lVar13;
                    do {
                      iVar12 = pRVar19->c2n[(long)pRVar19->size_per * (long)local_100 + lVar20];
                      lVar17 = (long)iVar12;
                      lVar13 = -1;
                      if (((-1 < lVar17) && (iVar12 < pRVar4->max)) &&
                         (lVar13 = pRVar4->global[lVar17], lVar13 < 0)) {
                        lVar13 = -1;
                      }
                      pRVar14 = pRVar4->real;
                      local_a8 = pRVar14[lVar17 * 0xf];
                      local_a0 = pRVar14[lVar17 * 0xf + 1];
                      local_98 = pRVar14[lVar17 * 0xf + 2];
                      uVar8 = ref_geom_find(local_b0,iVar12,2,id,&local_ec);
                      if (uVar8 != 0) {
                        pcVar18 = "find geom";
                        uVar15 = 0x301;
LAB_001bcae8:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                               ,uVar15,"ref_recon_local_immediate_cloud_geom",(ulong)uVar8,pcVar18);
                        pcVar18 = "fill immediate cloud";
                        uVar15 = 0x6bf;
                        goto LAB_001bc43d;
                      }
                      dVar2 = local_b8->displacement[(long)local_ec * 3];
                      pdVar1 = local_b8->displacement + (long)local_ec * 3 + 1;
                      dVar6 = *pdVar1;
                      dVar7 = pdVar1[1];
                      local_90 = SQRT(dVar7 * dVar7 + dVar2 * dVar2 + dVar6 * dVar6);
                      uVar8 = ref_cloud_store(one_layer[lVar21],lVar13,&local_a8);
                      if (uVar8 != 0) {
                        pcVar18 = "store could stencil";
                        uVar15 = 0x304;
                        goto LAB_001bcae8;
                      }
                      iVar12 = local_c0->node_per;
                      lVar20 = lVar20 + 1;
                      pRVar19 = local_c0;
                    } while ((int)lVar20 < iVar12);
                    pRVar10 = local_c0->ref_adj;
                    lVar13 = local_c8;
                    hessian = local_d0;
                  }
                  lVar13 = (long)pRVar10->item[(int)lVar13].next;
                  if (lVar13 == -1) goto LAB_001bc75a;
                  pRVar5 = pRVar10->item + lVar13;
                } while( true );
              }
              goto LAB_001bc75e;
            }
LAB_001bc76d:
            uVar8 = ref_recon_ghost_cloud(one_layer,ref_node);
            if (uVar8 != 0) {
              pcVar18 = "fill ghosts";
              uVar15 = 0x6c0;
              goto LAB_001bc43d;
            }
            uVar11 = (ulong)(uint)ref_node->max;
            if (0 < ref_node->max) {
              lVar21 = 0;
              do {
                if (-1 < ref_node->global[lVar21]) {
                  node = (REF_INT)lVar21;
                  uVar8 = ref_geom_id_supported(ref_grid->geom,node,2,id,&local_108);
                  if (uVar8 != 0) {
                    pcVar18 = "geom support";
                    uVar15 = 0x6c5;
                    goto LAB_001bc43d;
                  }
                  if ((local_108 != 0) && (ref_node->ref_mpi->id == ref_node->part[lVar21])) {
                    uVar8 = ref_recon_rsn(ref_grid,node,local_68,local_88,local_48);
                    if (uVar8 != 0) {
                      pcVar18 = "rsn";
                      uVar15 = 0x6c7;
                      goto LAB_001bc43d;
                    }
                    uVar8 = ref_cloud_deep_copy(&local_f8,one_layer[lVar21]);
                    if (uVar8 != 0) {
                      pcVar18 = "create ref_cloud";
                      uVar15 = 0x6ca;
                      goto LAB_001bc43d;
                    }
                    local_100 = (double *)((lVar21 * 0x18 & 0x7fffffff8U) + (long)hessian);
                    uVar16 = 2;
                    do {
                      uVar8 = ref_recon_grow_cloud_one_layer(local_f8,one_layer,ref_node);
                      if (uVar8 != 0) {
                        pcVar18 = "grow";
                        uVar15 = 0x6ce;
                        goto LAB_001bc43d;
                      }
                      lVar13 = -1;
                      if ((lVar21 < ref_node->max) &&
                         (lVar13 = ref_node->global[lVar21], lVar13 < 0)) {
                        lVar13 = -1;
                      }
                      RVar9 = ref_recon_kexact_rs(lVar13,local_f8,local_68,local_88,&local_e8);
                      pcVar18 = "REF_DIV_ZERO";
                      if ((RVar9 == 4 && 4 < uVar16) ||
                         (pcVar18 = "REF_ILL_CONDITIONED", RVar9 == 8 && 4 < uVar16)) {
                        ref_node_location(ref_node,node);
                        printf(" caught %s, for %d layers to kexact cloud; retry\n",pcVar18,
                               (ulong)uVar16);
                      }
                    } while ((RVar9 != 0) && (bVar22 = uVar16 < 8, uVar16 = uVar16 + 1, bVar22));
                    if (RVar9 == 0) {
                      if (hessian[lVar21 * 3 + 2] * hessian[lVar21 * 3 + 2] +
                          hessian[lVar21 * 3] * hessian[lVar21 * 3] +
                          hessian[lVar21 * 3 + 1] * hessian[lVar21 * 3 + 1] <
                          local_d8 * local_d8 + local_e8 * local_e8 + dStack_e0 * dStack_e0) {
                        local_100[2] = local_d8;
                        *local_100 = local_e8;
                        local_100[1] = dStack_e0;
                      }
                    }
                    else {
                      printf("skip contribution to face %d at ",local_110);
                      uVar8 = ref_node_location(ref_node,node);
                      if (uVar8 != 0) {
                        pcVar18 = "loc";
                        uVar15 = 0x6e6;
                        goto LAB_001bc43d;
                      }
                    }
                    uVar8 = ref_cloud_free(local_f8);
                    if (uVar8 != 0) {
                      pcVar18 = "free ref_cloud";
                      uVar15 = 0x6e9;
                      goto LAB_001bc43d;
                    }
                  }
                }
                lVar21 = lVar21 + 1;
                uVar11 = (ulong)ref_node->max;
              } while (lVar21 < (long)uVar11);
              if (0 < ref_node->max) {
                lVar21 = 0;
                do {
                  if (-1 < ref_node->global[lVar21]) {
                    ref_cloud_free(one_layer[lVar21]);
                    uVar11 = (ulong)(uint)ref_node->max;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < (int)uVar11);
              }
            }
            bVar22 = (int)id < local_104;
            id = id + 1;
          } while (bVar22);
        }
        free(one_layer);
        uVar8 = ref_node_ghost_dbl(ref_node,hessian,3);
        if (uVar8 == 0) {
          uVar8 = ref_recon_abs_value_hessian2((REF_GRID)ref_grid->node,hessian);
          if (uVar8 == 0) {
            return 0;
          }
          pcVar18 = "abs(H)";
          uVar15 = 0x6f5;
        }
        else {
          pcVar18 = "update ghosts";
          uVar15 = 0x6f3;
        }
      }
      else {
        pcVar18 = "face id range";
        uVar15 = 0x6b8;
      }
LAB_001bc43d:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar15,"ref_recon_rsn_hess_face",(ulong)uVar8,pcVar18);
    }
  }
  return uVar8;
LAB_001bc75a:
  iVar12 = pRVar4->max;
LAB_001bc75e:
  lVar21 = lVar21 + 1;
  if (iVar12 <= lVar21) goto LAB_001bc76d;
  goto LAB_001bc58e;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn_hess_face(REF_GRID ref_grid,
                                           REF_DBL *hessian) {
  REF_CLOUD *one_layer;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT node, im, min_id, max_id, id;
  REF_CLOUD ref_cloud;
  REF_DBL r[3], s[3], n[3];
  REF_DBL node_hessian[3];
  REF_STATUS status;
  REF_INT layer;
  REF_BOOL has_support;

  each_ref_node_valid_node(ref_node, node) {
    hessian[0 + 3 * node] = 0.0;
    hessian[1 + 3 * node] = 0.0;
    hessian[2 + 3 * node] = 0.0;
  }

  ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "face id range");

  for (id = min_id; id <= max_id; id++) {
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_cloud_geom(one_layer, ref_grid, id),
        "fill immediate cloud");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");

    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_geom_id_supported(ref_grid_geom(ref_grid), node, REF_GEOM_FACE,
                                id, &has_support),
          "geom support");
      if (has_support && ref_node_owned(ref_node, node)) {
        RSS(ref_recon_rsn(ref_grid, node, r, s, n), "rsn");
        /* use ref_cloud to get a unique list of halo(2) nodes */
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
              "grow");

          status = ref_recon_kexact_rs(ref_node_global(ref_node, node),
                                       ref_cloud, r, s, node_hessian);
          if (REF_DIV_ZERO == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_DIV_ZERO", layer);
          }
          if (REF_ILL_CONDITIONED == status && layer > 4) {
            ref_node_location(ref_node, node);
            printf(" caught %s, for %d layers to kexact cloud; retry\n",
                   "REF_ILL_CONDITIONED", layer);
          }
        }
        if (REF_SUCCESS == status) {
          if (ref_math_dot(&(hessian[3 * node]), &(hessian[3 * node])) <
              ref_math_dot(node_hessian, node_hessian)) {
            for (im = 0; im < 3; im++) {
              hessian[im + 3 * node] = node_hessian[im];
            }
          }
        } else {
          printf("skip contribution to face %d at ", id);
          RSS(ref_node_location(ref_node, node), "loc");
        }

        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
  }
  ref_free(one_layer);

  RSS(ref_node_ghost_dbl(ref_node, hessian, 3), "update ghosts");

  RSS(ref_recon_abs_value_hessian2(ref_grid, hessian), "abs(H)");

  return REF_SUCCESS;
}